

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O0

void __thiscall
luna::LexException::LexException<char_const(&)[34],std::__cxx11::string&,char_const(&)[2]>
          (LexException *this,char *module,int line,int column,char (*args) [34],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          char (*args_2) [2])

{
  int *in_stack_00000170;
  char *in_stack_00000178;
  int *in_stack_00000180;
  char *in_stack_00000188;
  char **in_stack_00000190;
  Exception *in_stack_00000198;
  char *in_stack_000001c0;
  char (*in_stack_000001c8) [34];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_000001d0;
  char (*in_stack_000001d8) [2];
  
  Exception::Exception((Exception *)0x1bde34);
  Exception::
  SetWhat<char_const*&,char,int&,char,int&,char,char_const(&)[34],std::__cxx11::string&,char_const(&)[2]>
            (in_stack_00000198,in_stack_00000190,in_stack_00000188,in_stack_00000180,
             in_stack_00000178,in_stack_00000170,in_stack_000001c0,in_stack_000001c8,
             in_stack_000001d0,in_stack_000001d8);
  return;
}

Assistant:

LexException(const char *module, int line, int column, Args&&... args)
        {
            SetWhat(module, ':', line, ':', column, ' ',
                    std::forward<Args>(args)...);
        }